

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (DescribeWalletAddressVisitor *this,WitnessV0ScriptHash *id)

{
  long lVar1;
  byte bVar2;
  long *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  uint160 hash;
  CRIPEMD160 hasher;
  CScript subscript;
  CRIPEMD160 *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb8;
  long *plVar3;
  undefined4 in_stack_fffffffffffffec0;
  VType in_stack_fffffffffffffec4;
  CRIPEMD160 *in_stack_fffffffffffffec8;
  undefined1 local_d0 [136];
  undefined1 local_48 [40];
  UniValue *in_stack_ffffffffffffffe0;
  CScript *in_stack_ffffffffffffffe8;
  DescribeWalletAddressVisitor *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea8);
  CScript::CScript((CScript *)in_stack_fffffffffffffea8);
  CRIPEMD160::CRIPEMD160(in_stack_fffffffffffffea8);
  uint160::uint160((uint160 *)in_stack_fffffffffffffea8);
  BaseHash<uint256>::begin((BaseHash<uint256> *)in_stack_fffffffffffffea8);
  CRIPEMD160::Write(in_stack_fffffffffffffec8,
                    (uchar *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    (size_t)in_stack_fffffffffffffeb8);
  base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffea8);
  CRIPEMD160::Finalize
            ((CRIPEMD160 *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (uchar *)in_stack_fffffffffffffeb8);
  bVar2 = 0;
  if (*in_RSI != 0) {
    plVar3 = (long *)*in_RSI;
    CScriptID::CScriptID((CScriptID *)in_stack_fffffffffffffea8,(uint160 *)0x4d9bc1);
    bVar2 = (**(code **)(*plVar3 + 0x10))(plVar3,local_d0,local_48);
  }
  if ((bVar2 & 1) != 0) {
    ProcessSubScript(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  }
  CScript::~CScript((CScript *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV0ScriptHash& id) const
    {
        UniValue obj(UniValue::VOBJ);
        CScript subscript;
        CRIPEMD160 hasher;
        uint160 hash;
        hasher.Write(id.begin(), 32).Finalize(hash.begin());
        if (provider && provider->GetCScript(CScriptID(hash), subscript)) {
            ProcessSubScript(subscript, obj);
        }
        return obj;
    }